

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet_tests.cpp
# Opt level: O2

void __thiscall
wallet::wallet_tests::ListCoinsTestingSetup::ListCoinsTestingSetup(ListCoinsTestingSetup *this)

{
  CKey *this_00;
  Chain *chain;
  TestOpts opts;
  undefined8 __p;
  CChain *cchain;
  long in_FS_OFFSET;
  pointer in_stack_fffffffffffffeb8;
  pointer in_stack_fffffffffffffec0;
  pointer in_stack_fffffffffffffec8;
  undefined8 in_stack_fffffffffffffed0;
  _Vector_base<const_char_*,_std::allocator<const_char_*>_> local_128;
  undefined4 local_110;
  undefined1 local_10c;
  CPubKey local_100;
  direct_or_indirect local_b8;
  CBlock local_98;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_128._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_128._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_128._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_110 = 0x1010101;
  local_10c = 0;
  opts.extra_args.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffffec0;
  opts.extra_args.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffffeb8;
  opts.extra_args.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_fffffffffffffec8;
  opts._24_8_ = in_stack_fffffffffffffed0;
  TestChain100Setup::TestChain100Setup(&this->super_TestChain100Setup,REGTEST,opts);
  std::_Vector_base<const_char_*,_std::allocator<const_char_*>_>::~_Vector_base(&local_128);
  (this->wallet)._M_t.super___uniq_ptr_impl<wallet::CWallet,_std::default_delete<wallet::CWallet>_>.
  _M_t.super__Tuple_impl<0UL,_wallet::CWallet_*,_std::default_delete<wallet::CWallet>_>.
  super__Head_base<0UL,_wallet::CWallet_*,_false>._M_head_impl = (CWallet *)0x0;
  this_00 = &(this->super_TestChain100Setup).coinbaseKey;
  CKey::GetPubKey(&local_100,this_00);
  GetScriptForRawPubKey((CScript *)&local_b8.indirect_contents,&local_100);
  TestChain100Setup::CreateAndProcessBlock
            (&local_98,&this->super_TestChain100Setup,
             (vector<CMutableTransaction,_std::allocator<CMutableTransaction>_> *)
             &stack0xfffffffffffffeb8,(CScript *)&local_b8.indirect_contents,(Chainstate *)0x0);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector(&local_98.vtx);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&local_b8.indirect_contents);
  std::vector<CMutableTransaction,_std::allocator<CMutableTransaction>_>::~vector
            ((vector<CMutableTransaction,_std::allocator<CMutableTransaction>_> *)
             &stack0xfffffffffffffeb8);
  chain = (this->super_TestChain100Setup).super_TestingSetup.super_ChainTestingSetup.
          super_BasicTestingSetup.m_node.chain._M_t.
          super___uniq_ptr_impl<interfaces::Chain,_std::default_delete<interfaces::Chain>_>._M_t.
          super__Tuple_impl<0UL,_interfaces::Chain_*,_std::default_delete<interfaces::Chain>_>.
          super__Head_base<0UL,_interfaces::Chain_*,_false>._M_head_impl;
  inline_assertion_check<true,std::unique_ptr<ChainstateManager,std::default_delete<ChainstateManager>>&>
            (&(this->super_TestChain100Setup).super_TestingSetup.super_ChainTestingSetup.
              super_BasicTestingSetup.m_node.chainman,
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/wallet_tests.cpp"
             ,0x24a,"ListCoinsTestingSetup","m_node.chainman");
  local_b8.indirect_contents.indirect = (char *)this;
  cchain = ListCoinsTestingSetup::anon_class_8_1_8991fb9c::operator()
                     ((anon_class_8_1_8991fb9c *)&local_b8.indirect_contents);
  CreateSyncedWallet((wallet *)&local_100,chain,cchain,this_00);
  __p = local_100.vch._0_8_;
  local_100.vch[0] = '\0';
  local_100.vch[1] = '\0';
  local_100.vch[2] = '\0';
  local_100.vch[3] = '\0';
  local_100.vch[4] = '\0';
  local_100.vch[5] = '\0';
  local_100.vch[6] = '\0';
  local_100.vch[7] = '\0';
  std::__uniq_ptr_impl<wallet::CWallet,_std::default_delete<wallet::CWallet>_>::reset
            ((__uniq_ptr_impl<wallet::CWallet,_std::default_delete<wallet::CWallet>_> *)
             &this->wallet,(pointer)__p);
  std::unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_>::~unique_ptr
            ((unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_> *)&local_100);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

ListCoinsTestingSetup()
    {
        CreateAndProcessBlock({}, GetScriptForRawPubKey(coinbaseKey.GetPubKey()));
        wallet = CreateSyncedWallet(*m_node.chain, WITH_LOCK(Assert(m_node.chainman)->GetMutex(), return m_node.chainman->ActiveChain()), coinbaseKey);
    }